

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

vm_dynfunc_ext * vm_dynfunc_ext::alloc_ext(CVmDynamicFunc *self,size_t bytecode_len,int obj_ref_cnt)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  int in_EDX;
  size_t in_RSI;
  undefined8 in_RDI;
  vm_dynfunc_ext *ext;
  size_t siz;
  vm_dynfunc_ext *this;
  
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,(long)(in_EDX + -1) * 4 + 0x34 + in_RSI,in_RDI);
  this = (vm_dynfunc_ext *)CONCAT44(extraout_var,iVar1);
  this->obj_ref_cnt = in_EDX;
  this->bytecode_len = in_RSI;
  vm_val_t::set_nil((vm_val_t *)this);
  vm_val_t::set_nil(&this->method_ctx);
  return this;
}

Assistant:

vm_dynfunc_ext *vm_dynfunc_ext::alloc_ext(
    VMG_ CVmDynamicFunc *self, size_t bytecode_len, int obj_ref_cnt)
{
    /* 
     *   Calculate how much space we need: we need the base structure, plus
     *   space for the object references, plus the dynamic object header, and
     *   the byte code array.  
     */
    size_t siz = sizeof(vm_dynfunc_ext)
                 + (obj_ref_cnt - 1)*sizeof_field(vm_dynfunc_ext, obj_refs[0])
                 + VMCO_PREFIX_LENGTH
                 + bytecode_len;
    
    /* allocate the memory */
    vm_dynfunc_ext *ext = (vm_dynfunc_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);
    
    /* remember the sizes */
    ext->obj_ref_cnt = obj_ref_cnt;
    ext->bytecode_len = bytecode_len;

    /* we don't have any source text yet */
    ext->src.set_nil();

    /* we don't have a method context object yet */
    ext->method_ctx.set_nil();

    /* return the new extension */
    return ext;
}